

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O3

void asm_href(ASMState *as,IRIns *ir,IROp merge)

{
  char cVar1;
  ushort uVar2;
  MCode *pMVar3;
  MCode *pMVar4;
  uint64_t uVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  char cVar9;
  byte bVar10;
  uint32_t uVar11;
  byte bVar12;
  byte bVar13;
  Reg r;
  uint uVar14;
  Reg RVar15;
  ulong uVar16;
  MCode *pMVar17;
  uint uVar18;
  uint uVar19;
  RegSet allow;
  Reg rr;
  x86Op xVar20;
  ulong uVar21;
  long lVar22;
  int32_t iVar23;
  uint uVar24;
  MCode *p;
  uint uVar25;
  MCode MVar26;
  uint uVar27;
  IRIns *pIVar28;
  uint uVar29;
  int iVar30;
  bool bVar31;
  Reg local_80;
  ulong local_58;
  
  bVar31 = true;
  if ((char)(ir->field_1).r < '\0') {
    bVar31 = (ir->field_1).s != '\0';
  }
  r = ra_dest(as,ir,0xbfef);
  uVar24 = ~(1 << (r & 0x1f)) & 0xbfef;
  pIVar28 = as->ir;
  cVar1 = *(char *)((long)pIVar28 + (ulong)(ir->field_0).op1 * 8 + 6);
  uVar14 = (uint)cVar1;
  if (cVar1 < '\0') {
    uVar14 = ra_allocref(as,(uint)(ir->field_0).op1,uVar24);
    pIVar28 = as->ir;
  }
  bVar6 = (byte)uVar14 & 0x1f;
  uVar18 = as->weakset & ~(1 << (uVar14 & 0x1f));
  as->weakset = uVar18;
  uVar2 = (ir->field_0).op2;
  uVar21 = (ulong)uVar2;
  bVar13 = *(byte *)((long)pIVar28 + uVar21 * 8 + 4);
  local_58 = 0x80;
  local_80 = 0x80;
  if ((short)uVar2 < 0) {
    uVar24 = uVar24 & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
    cVar1 = *(char *)((long)pIVar28 + uVar21 * 8 + 6);
    local_80 = (Reg)cVar1;
    if (cVar1 < '\0') {
      allow = 0xffff0000;
      if ((bVar13 & 0x1f) != 0xe) {
        allow = uVar24;
      }
      local_80 = ra_allocref(as,(uint)uVar2,allow);
      uVar18 = as->weakset;
    }
    as->weakset = uVar18 & ~(1 << (local_80 & 0x1f));
    RVar15 = ra_scratch(as,uVar24 & ~(1 << (local_80 & 0x1f)));
    local_58 = (ulong)RVar15;
  }
  pMVar17 = as->mcp;
  if (merge == IR_NE) {
    asm_guardcc(as,4);
  }
  else if (bVar31) {
    emit_loadu64(as,r,(uint64_t)(as->J[-1].penalty + 0x34));
  }
  pMVar3 = as->mcp;
  pMVar3[-2] = 'u';
  pMVar3[-1] = '\0';
  RVar15 = r | 0x80200;
  cVar9 = (char)r;
  bVar8 = (byte)(r & 7);
  pMVar3[-3] = bVar8 + cVar9 * '\b' | 0xc0;
  pMVar3[-4] = 0x85;
  bVar7 = (byte)(RVar15 >> 1) & 4;
  uVar24 = r >> 3 & 1;
  bVar6 = (byte)uVar24;
  pMVar3[-5] = bVar6 + bVar7 | 0x48;
  as->mcp = pMVar3 + -5;
  emit_rmro(as,XO_MOV,RVar15,r,0x10);
  pMVar4 = as->mcp;
  cVar1 = (char)pMVar4;
  if (merge == IR_EQ) {
    asm_guardcc(as,4);
  }
  else {
    pMVar4[-1] = (char)pMVar17 - cVar1;
    pMVar4[-2] = 't';
    as->mcp = pMVar4 + -2;
  }
  uVar29 = bVar13 & 0x1f;
  uVar18 = (uint)local_58;
  if (uVar29 == 0xe) {
    if ((short)uVar2 < 0) {
      pMVar17 = as->mcp;
      pMVar17[-1] = cVar1 - (char)pMVar17;
      pMVar17[-2] = 'z';
      as->mcp = pMVar17 + -2;
      emit_rmro(as,XO_UCOMISD,local_80,r,8);
      pMVar17 = as->mcp;
      pMVar17[-1] = cVar1 - (char)pMVar17;
      pMVar17[-2] = 's';
      as->mcp = pMVar17 + -3;
      pMVar17[-3] = 0xf2;
      xVar20 = XO_ARITHi8;
      rr = 7;
      iVar23 = 0xc;
LAB_00141b31:
      emit_rmro(as,xVar20,rr,r,iVar23);
    }
    else {
      iVar30 = pIVar28[uVar21 + 1].i;
      if ((char)(MCode)iVar30 == iVar30) {
        pMVar17 = as->mcp;
        as->mcp = pMVar17 + -1;
        pMVar17[-1] = (MCode)iVar30;
        xVar20 = XO_ARITHi8;
      }
      else {
        pMVar17 = as->mcp;
        *(int *)(pMVar17 + -4) = iVar30;
        as->mcp = pMVar17 + -4;
        xVar20 = XO_ARITHi;
      }
      emit_rmro(as,xVar20,7,r,8);
      pMVar17 = as->mcp;
      pMVar17[-1] = cVar1 - (char)pMVar17;
      pMVar17[-2] = 'u';
      as->mcp = pMVar17 + -2;
      iVar30 = *(int *)((long)pIVar28 + uVar21 * 8 + 0xc);
      if ((char)(MCode)iVar30 == iVar30) {
        as->mcp = pMVar17 + -3;
        pMVar17[-3] = (MCode)iVar30;
        xVar20 = XO_ARITHi8;
      }
      else {
        *(int *)(pMVar17 + -6) = iVar30;
        as->mcp = pMVar17 + -6;
        xVar20 = XO_ARITHi;
      }
LAB_00141bc4:
      emit_rmro(as,xVar20,7,r,0xc);
    }
  }
  else {
    if (uVar29 - 3 < 10) {
      if ((short)uVar2 < 0) {
        rr = uVar18 | 0x80200;
        xVar20 = XO_CMP;
        iVar23 = 8;
        goto LAB_00141b31;
      }
      uVar5 = pIVar28[uVar21 + 1].gcr.gcptr64;
      uVar19 = (uint)((ulong)((long)(char)(~*(byte *)((long)pIVar28 + uVar21 * 8 + 4) | 0xe0) <<
                             0x2f) >> 0x20) | (uint)(uVar5 >> 0x20);
      if ((int)(char)(MCode)uVar5 == (int)uVar5) {
        pMVar17 = as->mcp;
        as->mcp = pMVar17 + -1;
        pMVar17[-1] = (MCode)uVar5;
        xVar20 = XO_ARITHi8;
      }
      else {
        pMVar17 = as->mcp;
        *(int *)(pMVar17 + -4) = (int)uVar5;
        as->mcp = pMVar17 + -4;
        xVar20 = XO_ARITHi;
      }
      emit_rmro(as,xVar20,7,r,8);
      pMVar17 = as->mcp;
      pMVar17[-1] = cVar1 - (char)pMVar17;
      pMVar17[-2] = 'u';
      MVar26 = (MCode)(uVar5 >> 0x20);
      if ((int)(char)MVar26 == uVar19) {
        as->mcp = pMVar17 + -3;
        pMVar17[-3] = MVar26;
        xVar20 = XO_ARITHi8;
      }
      else {
        *(uint *)(pMVar17 + -6) = uVar19;
        as->mcp = pMVar17 + -6;
        xVar20 = XO_ARITHi;
      }
      goto LAB_00141bc4;
    }
    pMVar17 = as->mcp;
    *(uint *)(pMVar17 + -4) = ~uVar29 << 0xf | 0x7fff;
    as->mcp = pMVar17 + -4;
    emit_rmro(as,XO_ARITHi,7,r,0xc);
  }
  pMVar3[-1] = (char)*(undefined4 *)&as->mcp - (char)pMVar3;
  pMVar17 = as->mcp;
  if (pMVar17 < as->mclim) goto LAB_00142186;
  bVar13 = (byte)local_58;
  if (((short)uVar2 < 0) && (uVar29 - 3 < 10)) {
    pMVar17[-1] = ((byte)local_80 & 7) + bVar13 * '\b' | 0xc0;
    pMVar17[-2] = '\v';
    pMVar17[-3] = (byte)(local_80 >> 3) & 1 | (byte)(local_58 >> 1) & 4 | 0x48;
    as->mcp = pMVar17 + -3;
    emit_loadu64(as,uVar18,(ulong)~uVar29 << 0x2f);
LAB_00141c93:
    iVar30 = 1;
  }
  else {
    if ((short)uVar2 < 0) goto LAB_00141c93;
    uVar19 = *(byte *)((long)pIVar28 + uVar21 * 8 + 4) & 0x1f;
    if (uVar19 == 0xe) {
      uVar16 = (ulong)pIVar28[uVar21 + 1].field_1.op12;
      uVar19 = *(int *)((long)pIVar28 + uVar21 * 8 + 0xc) * 2;
LAB_00141cdd:
      uVar25 = ((uint)uVar16 ^ uVar19) - (uVar19 << 0xe | uVar19 >> 0x12);
      iVar30 = ((uVar19 << 0x13 | uVar19 >> 0xd) ^ uVar25) - (uVar25 * 0x2000 | uVar25 >> 0x13);
    }
    else if (uVar19 == 4) {
      iVar30 = *(int *)((long)pIVar28[uVar21 + 1] + 0xc);
    }
    else {
      if (2 < (byte)uVar19) {
        uVar16 = pIVar28[uVar21 + 1].gcr.gcptr64;
        uVar19 = ~uVar19 << 0xf | (uint)(uVar16 >> 0x20);
        goto LAB_00141cdd;
      }
      iVar30 = uVar19 - 1;
    }
    if (iVar30 == 0) {
      iVar23 = 0x28;
      goto LAB_00141e21;
    }
  }
  emit_rmro(as,0x30000fe,RVar15,uVar14,0x28);
  pMVar17 = as->mcp;
  as->mcp = pMVar17 + -1;
  pMVar17[-1] = '\x03';
  pMVar17 = as->mcp;
  pMVar17[-1] = bVar8 - 0x20;
  pMVar17[-2] = 0xc1;
  if ((r & 8) == 0) {
    pMVar17 = pMVar17 + -2;
  }
  else {
    pMVar17[-3] = 'A';
    pMVar17 = pMVar17 + -3;
  }
  bVar12 = 0;
  if ((r & 7) == 5) {
    pMVar17[-1] = '\0';
    pMVar17 = pMVar17 + -1;
    bVar12 = 0x40;
  }
  bVar10 = cVar9 * '\b';
  pMVar17[-1] = bVar8 + (bVar10 & 0x38) | 0x40;
  pMVar17[-2] = bVar10 & 0x38 | bVar12 | 4;
  pMVar17[-3] = 0x8d;
  uVar27 = r >> 1 & 4;
  uVar25 = uVar27 + uVar24;
  uVar19 = r >> 2 & 2 | uVar25;
  if (uVar19 == 0) {
    pMVar17 = pMVar17 + -3;
  }
  else {
    pMVar17[-4] = (byte)uVar19 | 0x40;
    pMVar17 = pMVar17 + -4;
  }
  as->mcp = pMVar17;
  if ((short)uVar2 < 0) {
    if ((char)uVar29 != '\x04') {
      emit_rmro(as,0x230000fe,r,uVar14,0x34);
      pMVar17 = as->mcp;
      bVar12 = bVar13 & 7 | bVar10 | 0xc0;
      pMVar17[-1] = bVar12;
      pMVar17[-2] = '+';
      uVar14 = uVar18 >> 3 & 1;
      uVar27 = uVar27 | uVar14;
      if (uVar27 == 0) {
        lVar22 = -2;
      }
      else {
        pMVar17[-3] = (byte)uVar27 | 0x40;
        lVar22 = -3;
      }
      as->mcp = pMVar17 + lVar22 + -1;
      pMVar17[lVar22 + -1] = '\r';
      pMVar17 = as->mcp;
      pMVar17[-1] = bVar13 & 7 | 0xc0;
      pMVar17[-2] = 0xc1;
      if (uVar14 == 0) {
        pMVar17 = pMVar17 + -2;
      }
      else {
        pMVar17[-3] = 'A';
        pMVar17 = pMVar17 + -3;
      }
      pMVar17[-1] = bVar12;
      pMVar17[-2] = '3';
      if (uVar27 == 0) {
        lVar22 = -2;
      }
      else {
        pMVar17[-3] = (byte)uVar27 | 0x40;
        lVar22 = -3;
      }
      as->mcp = pMVar17 + lVar22 + -1;
      pMVar17[lVar22 + -1] = '\x05';
      pMVar17 = as->mcp;
      pMVar17[-1] = bVar8 - 0x40;
      pMVar17[-2] = 0xc1;
      if ((r & 8) == 0) {
        pMVar17 = pMVar17 + -2;
      }
      else {
        pMVar17[-3] = 'A';
        pMVar17 = pMVar17 + -3;
      }
      bVar13 = bVar8 + bVar13 * '\b' | 0xc0;
      pMVar17[-1] = bVar13;
      pMVar17[-2] = '+';
      uVar14 = (uint)(local_58 >> 1) & 4;
      uVar24 = uVar14 | uVar24;
      bVar12 = (byte)uVar24;
      if (uVar24 == 0) {
        lVar22 = -2;
      }
      else {
        pMVar17[-3] = bVar12 | 0x40;
        lVar22 = -3;
      }
      as->mcp = pMVar17 + lVar22 + -1;
      pMVar17[lVar22 + -1] = '\x0e';
      pMVar17 = as->mcp;
      pMVar17[-1] = bVar8 - 0x40;
      pMVar17[-2] = 0xc1;
      if ((r & 8) == 0) {
        pMVar17 = pMVar17 + -2;
      }
      else {
        pMVar17[-3] = 'A';
        pMVar17 = pMVar17 + -3;
      }
      pMVar17[-1] = bVar13;
      pMVar17[-2] = '3';
      if (uVar24 == 0) {
        pMVar17 = pMVar17 + -2;
      }
      else {
        pMVar17[-3] = bVar12 | 0x40;
        pMVar17 = pMVar17 + -3;
      }
      as->mcp = pMVar17;
      if ((char)uVar29 == '\x0e') {
        pMVar17[-1] = bVar8 | bVar10 | 0xc0;
        pMVar17[-2] = '\x03';
        if (uVar25 == 0) {
          lVar22 = -2;
        }
        else {
          pMVar17[-3] = (byte)uVar25 | 0x40;
          lVar22 = -3;
        }
        as->mcp = pMVar17 + lVar22 + -1;
        pMVar17[lVar22 + -1] = ' ';
        pMVar17 = as->mcp;
        pMVar17[-1] = bVar8 - 0x18;
        pMVar17[-2] = 0xc1;
        pMVar17[-3] = bVar6 | 0x48;
        pMVar17[-4] = bVar13;
        pMVar17[-5] = 0x8b;
        if (uVar24 == 0) {
          pMVar17 = pMVar17 + -5;
        }
        else {
          pMVar17[-6] = bVar12 | 0x40;
          pMVar17 = pMVar17 + -6;
        }
        as->mcp = pMVar17;
        emit_rr(as,XO_MOVDto,local_80 | 0x80200,r);
        return;
      }
      bVar13 = (byte)local_80 & 7;
      pMVar17[-1] = (byte)(uVar18 << 3) | bVar13 | 0xc0;
      pMVar17[-2] = 0x8b;
      uVar24 = local_80 >> 3 & 1;
      uVar14 = uVar14 | uVar24;
      if (uVar14 == 0) {
        pMVar17 = pMVar17 + -2;
      }
      else {
        pMVar17[-3] = (byte)uVar14 | 0x40;
        pMVar17 = pMVar17 + -3;
      }
      as->mcp = pMVar17;
      if (as->mclim <= pMVar17) {
        emit_gri(as,0x838106,r,~uVar29 << 0xf);
        pMVar17 = as->mcp;
        uVar11 = as->flags;
        as->mcp = pMVar17 + -1;
        pMVar17[-1] = ' ';
        if ((uVar11 & 0x40) != 0) {
          emit_mrm(as,0xf0fbe3c4,r,local_80);
          return;
        }
        pMVar17 = as->mcp;
        pMVar17[-1] = bVar8 - 0x18;
        pMVar17[-2] = 0xc1;
        pMVar17[-3] = bVar6 | 0x48;
        pMVar17[-4] = bVar13 | cVar9 * '\b' | 0xc0;
        pMVar17[-5] = 0x8b;
        pMVar17[-6] = (byte)uVar24 | bVar7 | 0x48;
        as->mcp = pMVar17 + -6;
        return;
      }
LAB_00142186:
      asm_mclimit(as);
    }
    emit_rmro(as,0x230000fe,r,local_80,0xc);
  }
  else {
    emit_gri(as,0x838104,r,iVar30);
  }
  iVar23 = 0x34;
  RVar15 = r;
LAB_00141e21:
  emit_rmro(as,XO_MOV,RVar15,uVar14,iVar23);
  return;
}

Assistant:

static void asm_href(ASMState *as, IRIns *ir, IROp merge)
{
  RegSet allow = RSET_GPR;
  int destused = ra_used(ir);
  Reg dest = ra_dest(as, ir, allow);
  Reg tab = ra_alloc1(as, ir->op1, rset_clear(allow, dest));
  Reg key = RID_NONE, tmp = RID_NONE;
  IRIns *irkey = IR(ir->op2);
  int isk = irref_isk(ir->op2);
  IRType1 kt = irkey->t;
  uint32_t khash;
  MCLabel l_end, l_loop, l_next;

  if (!isk) {
    rset_clear(allow, tab);
    key = ra_alloc1(as, ir->op2, irt_isnum(kt) ? RSET_FPR : allow);
    if (LJ_GC64 || !irt_isstr(kt))
      tmp = ra_scratch(as, rset_exclude(allow, key));
  }

  /* Key not found in chain: jump to exit (if merged) or load niltv. */
  l_end = emit_label(as);
  if (merge == IR_NE)
    asm_guardcc(as, CC_E);  /* XI_JMP is not found by lj_asm_patchexit. */
  else if (destused)
    emit_loada(as, dest, niltvg(J2G(as->J)));

  /* Follow hash chain until the end. */
  l_loop = emit_sjcc_label(as, CC_NZ);
  emit_rr(as, XO_TEST, dest|REX_GC64, dest);
  emit_rmro(as, XO_MOV, dest|REX_GC64, dest, offsetof(Node, next));
  l_next = emit_label(as);

  /* Type and value comparison. */
  if (merge == IR_EQ)
    asm_guardcc(as, CC_E);
  else
    emit_sjcc(as, CC_E, l_end);
  if (irt_isnum(kt)) {
    if (isk) {
      /* Assumes -0.0 is already canonicalized to +0.0. */
      emit_gmroi(as, XG_ARITHi(XOg_CMP), dest, offsetof(Node, key.u32.lo),
		 (int32_t)ir_knum(irkey)->u32.lo);
      emit_sjcc(as, CC_NE, l_next);
      emit_gmroi(as, XG_ARITHi(XOg_CMP), dest, offsetof(Node, key.u32.hi),
		 (int32_t)ir_knum(irkey)->u32.hi);
    } else {
      emit_sjcc(as, CC_P, l_next);
      emit_rmro(as, XO_UCOMISD, key, dest, offsetof(Node, key.n));
      emit_sjcc(as, CC_AE, l_next);
      /* The type check avoids NaN penalties and complaints from Valgrind. */
#if LJ_64 && !LJ_GC64
      emit_u32(as, LJ_TISNUM);
      emit_rmro(as, XO_ARITHi, XOg_CMP, dest, offsetof(Node, key.it));
#else
      emit_i8(as, LJ_TISNUM);
      emit_rmro(as, XO_ARITHi8, XOg_CMP, dest, offsetof(Node, key.it));
#endif
    }
#if LJ_64 && !LJ_GC64
  } else if (irt_islightud(kt)) {
    emit_rmro(as, XO_CMP, key|REX_64, dest, offsetof(Node, key.u64));
#endif
#if LJ_GC64
  } else if (irt_isaddr(kt)) {
    if (isk) {
      TValue k;
      k.u64 = ((uint64_t)irt_toitype(irkey->t) << 47) | irkey[1].tv.u64;
      emit_gmroi(as, XG_ARITHi(XOg_CMP), dest, offsetof(Node, key.u32.lo),
		 k.u32.lo);
      emit_sjcc(as, CC_NE, l_next);
      emit_gmroi(as, XG_ARITHi(XOg_CMP), dest, offsetof(Node, key.u32.hi),
		 k.u32.hi);
    } else {
      emit_rmro(as, XO_CMP, tmp|REX_64, dest, offsetof(Node, key.u64));
    }
  } else {
    lj_assertA(irt_ispri(kt) && !irt_isnil(kt), "bad HREF key type");
    emit_u32(as, (irt_toitype(kt)<<15)|0x7fff);
    emit_rmro(as, XO_ARITHi, XOg_CMP, dest, offsetof(Node, key.it));
#else
  } else {
    if (!irt_ispri(kt)) {
      lj_assertA(irt_isaddr(kt), "bad HREF key type");
      if (isk)
	emit_gmroi(as, XG_ARITHi(XOg_CMP), dest, offsetof(Node, key.gcr),
		   ptr2addr(ir_kgc(irkey)));
      else
	emit_rmro(as, XO_CMP, key, dest, offsetof(Node, key.gcr));
      emit_sjcc(as, CC_NE, l_next);
    }
    lj_assertA(!irt_isnil(kt), "bad HREF key type");
    emit_i8(as, irt_toitype(kt));
    emit_rmro(as, XO_ARITHi8, XOg_CMP, dest, offsetof(Node, key.it));
#endif
  }